

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QFontEngine::FaceId,QFreetypeFace*>::emplace<QFreetypeFace*const&>
          (QHash<QFontEngine::FaceId,QFreetypeFace*> *this,FaceId *key,QFreetypeFace **args)

{
  QFreetypeFace *pQVar1;
  ulong uVar2;
  Data<QHashPrivate::Node<QFontEngine::FaceId,_QFreetypeFace_*>_> *pDVar3;
  long in_FS_OFFSET;
  piter pVar4;
  QHash<QFontEngine::FaceId,_QFreetypeFace_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QFreetypeFace **)this;
  if (pQVar1 != (QFreetypeFace *)0x0) {
    if (*(uint *)&pQVar1->face < 2) {
      uVar2._0_4_ = pQVar1->xsize;
      uVar2._4_4_ = pQVar1->ysize;
      if (pQVar1->mm_var < (FT_MM_Var *)(uVar2 >> 1)) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar4 = (piter)emplace_helper<QFreetypeFace*const&>(this,key,args);
          return (iterator)pVar4;
        }
      }
      else {
        local_28.d = (Data *)*args;
        pVar4 = (piter)emplace_helper<QFreetypeFace*>(this,key,(QFreetypeFace **)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar4;
        }
      }
      goto LAB_00607b51;
    }
    if ((pQVar1 != (QFreetypeFace *)0x0) && (*(int *)&pQVar1->face != -1)) {
      LOCK();
      *(int *)&pQVar1->face = *(int *)&pQVar1->face + 1;
      UNLOCK();
    }
  }
  pDVar3 = *(Data<QHashPrivate::Node<QFontEngine::FaceId,_QFreetypeFace_*>_> **)this;
  local_28.d = (Data *)pQVar1;
  if ((pDVar3 == (Data<QHashPrivate::Node<QFontEngine::FaceId,_QFreetypeFace_*>_> *)0x0) ||
     (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    pDVar3 = QHashPrivate::Data<QHashPrivate::Node<QFontEngine::FaceId,_QFreetypeFace_*>_>::detached
                       (pDVar3);
    *(Data<QHashPrivate::Node<QFontEngine::FaceId,_QFreetypeFace_*>_> **)this = pDVar3;
  }
  pVar4 = (piter)emplace_helper<QFreetypeFace*const&>(this,key,args);
  QHash<QFontEngine::FaceId,_QFreetypeFace_*>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar4;
  }
LAB_00607b51:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }